

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPtIsOnLocus.cpp
# Opt level: O2

bool ParseTestPtIsOnLocus(string *sString)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __a;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  string_type local_558;
  LLPoint llProjPt;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4c0;
  string sRxPat;
  sregex_token_iterator it;
  string soResult;
  string soTestPtLong;
  string soTestPtLat;
  string soLocEndDist;
  string soLocStartDist;
  string soLocEndLong;
  string soLocEndLat;
  string soLocStartLong;
  string soLocStartLat;
  string soGeodesicEndLong;
  string soGeodesicEndLat;
  string soGeodesicStartLong;
  string soGeodesicStartLat;
  string soTestId;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  regex pat;
  LLPoint llTestPt;
  int sub_matches [14];
  
  trim(sString," \t\n\r\f\v");
  soTestId._M_dataplus._M_p = (pointer)&soTestId.field_2;
  soTestId._M_string_length = 0;
  soTestId.field_2._M_local_buf[0] = '\0';
  soGeodesicStartLat._M_dataplus._M_p = (pointer)&soGeodesicStartLat.field_2;
  soGeodesicStartLat._M_string_length = 0;
  soGeodesicStartLong._M_dataplus._M_p = (pointer)&soGeodesicStartLong.field_2;
  soGeodesicStartLong._M_string_length = 0;
  soGeodesicStartLat.field_2._M_local_buf[0] = '\0';
  soGeodesicStartLong.field_2._M_local_buf[0] = '\0';
  soGeodesicEndLat._M_dataplus._M_p = (pointer)&soGeodesicEndLat.field_2;
  soGeodesicEndLat._M_string_length = 0;
  soGeodesicEndLong._M_dataplus._M_p = (pointer)&soGeodesicEndLong.field_2;
  soGeodesicEndLong._M_string_length = 0;
  soGeodesicEndLat.field_2._M_local_buf[0] = '\0';
  soGeodesicEndLong.field_2._M_local_buf[0] = '\0';
  soLocStartLat._M_dataplus._M_p = (pointer)&soLocStartLat.field_2;
  soLocStartLat._M_string_length = 0;
  soLocStartLong._M_dataplus._M_p = (pointer)&soLocStartLong.field_2;
  soLocStartLong._M_string_length = 0;
  soLocStartLat.field_2._M_local_buf[0] = '\0';
  soLocStartLong.field_2._M_local_buf[0] = '\0';
  soLocEndLat._M_dataplus._M_p = (pointer)&soLocEndLat.field_2;
  soLocEndLat._M_string_length = 0;
  soLocEndLong._M_dataplus._M_p = (pointer)&soLocEndLong.field_2;
  soLocEndLong._M_string_length = 0;
  soLocEndLat.field_2._M_local_buf[0] = '\0';
  soLocEndLong.field_2._M_local_buf[0] = '\0';
  soLocStartDist._M_dataplus._M_p = (pointer)&soLocStartDist.field_2;
  soLocStartDist._M_string_length = 0;
  soLocEndDist._M_dataplus._M_p = (pointer)&soLocEndDist.field_2;
  soLocEndDist._M_string_length = 0;
  soLocStartDist.field_2._M_local_buf[0] = '\0';
  soLocEndDist.field_2._M_local_buf[0] = '\0';
  soTestPtLat._M_dataplus._M_p = (pointer)&soTestPtLat.field_2;
  soTestPtLat._M_string_length = 0;
  soTestPtLong._M_dataplus._M_p = (pointer)&soTestPtLong.field_2;
  soTestPtLong._M_string_length = 0;
  soTestPtLat.field_2._M_local_buf[0] = '\0';
  soTestPtLong.field_2._M_local_buf[0] = '\0';
  soResult._M_dataplus._M_p = (pointer)&soResult.field_2;
  soResult._M_string_length = 0;
  soResult.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&sRxPat,"([a-zA-Z]*\\d*)[,]",(allocator *)&it);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::string::append((char *)&sRxPat);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&pat,&sRxPat,0x11);
  sub_matches[8] = 9;
  sub_matches[9] = 10;
  sub_matches[10] = 0xb;
  sub_matches[0xb] = 0xc;
  sub_matches[4] = 5;
  sub_matches[5] = 6;
  sub_matches[6] = 7;
  sub_matches[7] = 8;
  sub_matches[0] = 1;
  sub_matches[1] = 2;
  sub_matches[2] = 3;
  sub_matches[3] = 4;
  sub_matches[0xc] = 0xd;
  sub_matches[0xd] = 0xe;
  __a._M_current = (sString->_M_dataplus)._M_p;
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<14ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)&it,__a,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__a._M_current + sString->_M_string_length),&pat,&sub_matches,0);
  llTestPt.latitude = 0.0;
  llTestPt.longitude = 0.0;
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=(&it,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                            *)&llTestPt);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soTestId,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soGeodesicStartLat,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soGeodesicStartLong,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soGeodesicEndLat,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soGeodesicEndLong,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocStartLat,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocStartLong,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocEndLat,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocEndLong,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocStartDist,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soLocEndDist,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soTestPtLat,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&llProjPt,&it,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str(&local_558,local_4c0);
    std::__cxx11::string::operator=((string *)&soTestPtLong,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&llProjPt);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&llProjPt,it._M_result);
    std::__cxx11::string::operator=((string *)&soResult,(string *)&llProjPt);
    std::__cxx11::string::~string((string *)&llProjPt);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)&llTestPt);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator(&it);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pat);
  std::__cxx11::string::~string((string *)&sRxPat);
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  it._M_position._M_match._M_begin._M_current = (char *)0x0;
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_128,(string *)&soGeodesicStartLat);
  dVar1 = ParseLatitude(&local_128);
  std::__cxx11::string::string((string *)&local_148,(string *)&soGeodesicStartLong);
  dVar2 = ParseLongitude(&local_148);
  it._M_position._M_begin._M_current = (char *)(dVar1 * 0.017453292519943295);
  it._M_position._M_end._M_current = (char *)(dVar2 * 0.017453292519943295);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_168,(string *)&soGeodesicEndLat);
  dVar1 = ParseLatitude(&local_168);
  std::__cxx11::string::string((string *)&local_188,(string *)&soGeodesicEndLong);
  dVar2 = ParseLongitude(&local_188);
  it._M_position._M_pregex = (regex_type *)(dVar1 * 0.017453292519943295);
  it._M_position._24_8_ = dVar2 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string((string *)&local_1a8,(string *)&soLocStartLat);
  dVar1 = ParseLatitude(&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,(string *)&soLocStartLong);
  dVar2 = ParseLongitude(&local_1c8);
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar1 * 0.017453292519943295);
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(dVar2 * 0.017453292519943295);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1e8,(string *)&soLocEndLat);
  dVar1 = ParseLatitude(&local_1e8);
  std::__cxx11::string::string((string *)&local_208,(string *)&soLocEndLong);
  dVar2 = ParseLongitude(&local_208);
  it._M_position._M_match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(dVar1 * 0.017453292519943295);
  it._M_position._M_match._M_begin._M_current = (char *)(dVar2 * 0.017453292519943295);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  dVar1 = atof(soLocStartDist._M_dataplus._M_p);
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(dVar1 * 1852.0);
  dVar1 = atof(soLocEndDist._M_dataplus._M_p);
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)(dVar1 * 1852.0);
  it._M_subs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::__cxx11::string::string((string *)&local_228,(string *)&soTestPtLat);
  dVar1 = ParseLatitude(&local_228);
  std::__cxx11::string::string((string *)&local_248,(string *)&soTestPtLong);
  dVar2 = ParseLongitude(&local_248);
  llTestPt.latitude = dVar1 * 0.017453292519943295;
  llTestPt.longitude = dVar2 * 0.017453292519943295;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  llProjPt.latitude = 0.0;
  llProjPt.longitude = 0.0;
  bVar3 = GeoCalcs::PtIsOnLocus((Locus *)&it,&llTestPt,&llProjPt,0.001);
  uVar4 = atoi(soResult._M_dataplus._M_p);
  uVar6 = (uint)bVar3;
  if (uVar4 != uVar6) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&soTestId);
    poVar5 = std::operator<<(poVar5," failed: expected result of ");
    poVar5 = std::operator<<(poVar5,(string *)&soResult);
    poVar5 = std::operator<<(poVar5,"  cacled: ");
    std::ostream::operator<<(poVar5,uVar6);
  }
  std::__cxx11::string::~string((string *)&soResult);
  std::__cxx11::string::~string((string *)&soTestPtLong);
  std::__cxx11::string::~string((string *)&soTestPtLat);
  std::__cxx11::string::~string((string *)&soLocEndDist);
  std::__cxx11::string::~string((string *)&soLocStartDist);
  std::__cxx11::string::~string((string *)&soLocEndLong);
  std::__cxx11::string::~string((string *)&soLocEndLat);
  std::__cxx11::string::~string((string *)&soLocStartLong);
  std::__cxx11::string::~string((string *)&soLocStartLat);
  std::__cxx11::string::~string((string *)&soGeodesicEndLong);
  std::__cxx11::string::~string((string *)&soGeodesicEndLat);
  std::__cxx11::string::~string((string *)&soGeodesicStartLong);
  std::__cxx11::string::~string((string *)&soGeodesicStartLat);
  std::__cxx11::string::~string((string *)&soTestId);
  return uVar4 == uVar6;
}

Assistant:

bool ParseTestPtIsOnLocus(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLong, soGeodesicEndLat, soGeodesicEndLong, soLocStartLat, soLocStartLong;
    string soLocEndLat, soLocEndLong, soLocStartDist, soLocEndDist, soTestPtLat, soTestPtLong, soResult;
    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([0-1])";
        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLong = *it++;
            soGeodesicEndLat = *it++;
            soGeodesicEndLong = *it++;
            soLocStartLat = *it++;
            soLocStartLong = *it++;
            soLocEndLat = *it++;
            soLocEndLong = *it++;
            soLocStartDist = *it++;
            soLocEndDist = *it++;
            soTestPtLat = *it++;
            soTestPtLong = *it++;
            soResult = *it;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    Locus locus;
    locus.geoStart.Set(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLong)));
    locus.geoEnd.Set(Deg2Rad(ParseLatitude(soGeodesicEndLat)), Deg2Rad(ParseLongitude(soGeodesicEndLong)));
    locus.locusStart.Set(Deg2Rad(ParseLatitude(soLocStartLat)), Deg2Rad(ParseLongitude(soLocStartLong)));
    locus.locusEnd.Set(Deg2Rad(ParseLatitude(soLocEndLat)), Deg2Rad(ParseLongitude(soLocEndLong)));
    locus.startDist = NmToMeters(atof(soLocStartDist.c_str()));
    locus.endDist = NmToMeters(atof(soLocEndDist.c_str()));
    locus.lineType = 0;

    LLPoint llTestPt(LLPoint(Deg2Rad(ParseLatitude(soTestPtLat)), Deg2Rad(ParseLongitude(soTestPtLong))));
    LLPoint llProjPt;

    // Using a low 1e-3 tolerance value (0.5 mm) to test if point is on locus
    // Tests show this to be the lowest tolerance can be set and pass the
    // 8260.54A test results page.  If values had been computed internal
    // in doubles then 1e-8 could have easily been used.
    int bResult = PtIsOnLocus(locus, llTestPt, llProjPt, 1e-3);
    if (bResult != atoi(soResult.c_str()))
    {
        cout << "\n" << soTestId << " failed: expected result of " << soResult << "  cacled: " << bResult;
        bPassed = false;
    }
    return bPassed;
}